

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alice.cpp
# Opt level: O0

void __thiscall Alice::Alice(Alice *this)

{
  Server *this_00;
  allocator local_41;
  string local_40 [48];
  Alice *local_10;
  Alice *this_local;
  
  local_10 = this;
  Party::Party(&this->super_Party);
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::vector(&this->Pi_P_diff_R_PB_R_PA);
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::vector(&this->Pi_D_diff_R_DB_R_DA);
  LoadProgramShare(this);
  LoadDataShare(this);
  LoadCorrelatedRandoms(this);
  LoadAlphaRandoms(this);
  LoadNextRandomPermutation(this);
  LoadNextShuffleVectors(this);
  this_00 = (Server *)operator_new(0x180);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"Alice",&local_41);
  Server::Server(this_00,(string *)local_40);
  this->srv = this_00;
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  return;
}

Assistant:

Alice::Alice()
{
    LoadProgramShare();
    LoadDataShare();
    LoadCorrelatedRandoms();
    LoadAlphaRandoms();
    LoadNextRandomPermutation();
    LoadNextShuffleVectors();  
    srv = new Server("Alice");    
}